

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_csupport.cpp
# Opt level: O3

void kmpc_set_blocktime(int arg)

{
  int iVar1;
  
  iVar1 = __kmp_get_global_thread_id_reg();
  __kmp_aux_set_blocktime(arg,__kmp_threads[iVar1],*(int *)(__kmp_threads[iVar1]->th_pad + 0x20));
  return;
}

Assistant:

void kmpc_set_blocktime(int arg) {
  int gtid, tid;
  kmp_info_t *thread;

  gtid = __kmp_entry_gtid();
  tid = __kmp_tid_from_gtid(gtid);
  thread = __kmp_thread_from_gtid(gtid);

  __kmp_aux_set_blocktime(arg, thread, tid);
}